

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QModelIndex>::moveAppend
          (QGenericArrayOps<QModelIndex> *this,QModelIndex *b,QModelIndex *e)

{
  qsizetype *pqVar1;
  QModelIndex *pQVar2;
  QModelIndex *pQVar3;
  long lVar4;
  quintptr qVar5;
  int iVar6;
  
  if (b != e) {
    pQVar3 = (this->super_QArrayDataPointer<QModelIndex>).ptr;
    for (; b < e; b = b + 1) {
      lVar4 = (this->super_QArrayDataPointer<QModelIndex>).size;
      pQVar3[lVar4].m.ptr = (b->m).ptr;
      iVar6 = b->c;
      qVar5 = b->i;
      pQVar2 = pQVar3 + lVar4;
      pQVar2->r = b->r;
      pQVar2->c = iVar6;
      pQVar2->i = qVar5;
      pqVar1 = &(this->super_QArrayDataPointer<QModelIndex>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }